

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,string *w)

{
  long lVar1;
  entry_type eVar2;
  
  lVar1 = std::__cxx11::string::find
                    ((string *)w,
                     (ulong)&((this->args_).
                              super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ->label);
  if (lVar1 == 0) {
    eVar2 = label;
  }
  else {
    lVar1 = std::__cxx11::string::find
                      ((string *)w,
                       (ulong)&((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id);
    eVar2 = (lVar1 == 0) * '\x02';
  }
  return eVar2;
}

Assistant:

entry_type Dictionary::getType(const std::string& w) const {
	if(w.find(args_->label) == 0)
		return entry_type::label;
	else
	{
		if(w.find(args_->id) == 0)
			return entry_type::id;
		else
			return entry_type::word;
	}
}